

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_archive_string_conversion.c
# Opt level: O3

void test_archive_string_conversion_utf8_utf16(void)

{
  skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                 ,L'Ώ');
  test_skipping("This test is meant to verify unicode string handling on Windows");
  return;
}

Assistant:

DEFINE_TEST(test_archive_string_conversion_utf8_utf16)
{
#if !defined(_WIN32) || defined(__CYGWIN__)
	skipping("This test is meant to verify unicode string handling on Windows");
#else
	struct archive_mstring mstr;
	const wchar_t* wcs_string;

	memset(&mstr, 0, sizeof(mstr));

	assertEqualInt(6,
	    archive_mstring_copy_utf8(&mstr, "\xD0\xBF\xD1\x80\xD0\xB8"));

	/* Conversion from UTF-8 to WCS should always succeed */
	assertEqualInt(ARCHIVE_OK,
	    archive_mstring_get_wcs(NULL, &mstr, &wcs_string));
	assertEqualWString(L"\U0000043f\U00000440\U00000438", wcs_string);

	archive_mstring_clean(&mstr);
#endif
}